

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

uint32_t lzma_mf_bt4_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint32_t uVar1;
  uint32_t cur_match;
  uint8_t *puVar2;
  uint32_t *puVar3;
  bool bVar4;
  uint uVar5;
  lzma_match *plVar6;
  uint uVar7;
  uint32_t pos;
  uint len_limit;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  
  uVar5 = mf->read_pos;
  uVar7 = mf->write_pos - uVar5;
  len_limit = mf->nice_len;
  if (uVar7 < mf->nice_len) {
    if (uVar7 < 4) {
      if (mf->action == LZMA_RUN) {
        __assert_fail("mf->action != LZMA_RUN",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2e9,"uint32_t lzma_mf_bt4_find(lzma_mf *, lzma_match *)");
      }
LAB_004ae76c:
      move_pending(mf);
      return 0;
    }
    len_limit = uVar7;
    if (mf->action == LZMA_SYNC_FLUSH) goto LAB_004ae76c;
  }
  puVar2 = mf->buffer;
  puVar3 = mf->hash;
  cur = puVar2 + uVar5;
  pos = mf->offset + uVar5;
  uVar9 = (uint)puVar2[(ulong)uVar5 + 1] ^ lzma_crc32_table[0][puVar2[uVar5]];
  uVar7 = (uint)puVar2[(ulong)uVar5 + 2] << 8 ^ uVar9;
  uVar9 = uVar9 & 0x3ff;
  uVar11 = (ulong)(uVar7 & 0xffff);
  uVar10 = puVar3[uVar9];
  uVar8 = pos - uVar10;
  uVar1 = puVar3[uVar11 + 0x400];
  uVar5 = ((lzma_crc32_table[0][puVar2[(ulong)uVar5 + 3]] << 5 ^ uVar7) & mf->hash_mask) + 0x10400;
  cur_match = puVar3[uVar5];
  puVar3[uVar9] = pos;
  puVar3[uVar11 + 0x400] = pos;
  puVar3[uVar5] = pos;
  uVar5 = mf->cyclic_size;
  lVar13 = 0;
  bVar4 = true;
  uVar7 = 1;
  if ((uVar8 < uVar5) && (cur[-(ulong)uVar8] == *cur)) {
    matches->len = 2;
    matches->dist = uVar8 - 1;
    lVar13 = 1;
    uVar7 = 2;
    bVar4 = false;
  }
  if (((uVar1 == uVar10) || (uVar9 = pos - uVar1, uVar5 <= uVar9)) || (cur[-(ulong)uVar9] != *cur))
  {
    if (bVar4) {
      uVar11 = 0;
LAB_004ae8cc:
      uVar10 = 3;
      if (3 < uVar7) {
        uVar10 = uVar7;
      }
      plVar6 = bt_find_func(len_limit,pos,cur,cur_match,mf->depth,mf->son,mf->cyclic_pos,uVar5,
                            matches + uVar11,uVar10);
      uVar12 = (uint)((ulong)((long)plVar6 - (long)matches) >> 3);
      goto LAB_004ae8fe;
    }
    uVar12 = 1;
  }
  else {
    uVar12 = (int)lVar13 + 1;
    matches[lVar13].dist = uVar9 - 1;
    uVar7 = 3;
    uVar8 = uVar9;
  }
  for (; len_limit != uVar7; uVar7 = uVar7 + 1) {
    if (cur[(ulong)uVar7 - (ulong)uVar8] != cur[uVar7]) {
      matches[uVar12 - 1].len = uVar7;
      uVar11 = (ulong)uVar12;
      goto LAB_004ae8cc;
    }
  }
  matches[uVar12 - 1].len = len_limit;
  bt_skip_func(len_limit,pos,cur,cur_match,mf->depth,mf->son,mf->cyclic_pos,uVar5);
LAB_004ae8fe:
  move_pos(mf);
  return uVar12;
}

Assistant:

extern uint32_t
lzma_mf_bt4_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t temp, hash_value, hash_2_value, hash_3_value; /* hash_4_calc */
	uint32_t delta2, delta3, cur_match;
	uint32_t len_best = 1;
	uint32_t matches_count = 0;

	header_find(true, 4);

	hash_4_calc();

	delta2 = pos - mf->hash[hash_2_value];
	delta3 = pos - mf->hash[FIX_3_HASH_SIZE + hash_3_value];
	cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

	mf->hash[hash_2_value] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
	mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = 2;
		matches[0].len = 2;
		matches[0].dist = delta2 - 1;
		matches_count = 1;
	}

	if (delta2 != delta3 && delta3 < mf->cyclic_size
			&& *(cur - delta3) == *cur) {
		len_best = 3;
		matches[matches_count++].dist = delta3 - 1;
		delta2 = delta3;
	}

	if (matches_count != 0) {
		for ( ; len_best != len_limit; ++len_best)
			if (*(cur + len_best - delta2) != cur[len_best])
				break;

		matches[matches_count - 1].len = len_best;

		if (len_best == len_limit) {
			bt_skip();
			return matches_count;
		}
	}

	if (len_best < 3)
		len_best = 3;

	bt_find(len_best);
}